

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Functor * __thiscall Hcell::f(Functor *__return_storage_ptr__,Hcell *this)

{
  if (this->tag == Functor) {
    Functor::Functor(__return_storage_ptr__,&this->f_);
    return __return_storage_ptr__;
  }
  __assert_fail("tag == Htag::Functor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x88,"Functor Hcell::f() const");
}

Assistant:

Functor f() const {
        assert(tag == Htag::Functor);
        return f_;
    }